

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

void cuddLocalCacheInsert(DdLocalCache *cache,DdNodePtr *key,DdNode *value)

{
  undefined8 *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)cache->keysize;
  uVar2 = *(int *)key * 0x40f1f9;
  if (1 < uVar3) {
    uVar4 = 1;
    do {
      uVar2 = uVar2 * 0xc00005 + *(int *)(key + uVar4);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  puVar1 = (undefined8 *)
           ((long)cache->item->key +
           ((ulong)((uVar2 >> ((byte)cache->shift & 0x1f)) * cache->itemsize) - 8));
  memcpy(puVar1 + 1,key,uVar3 << 3);
  *puVar1 = value;
  return;
}

Assistant:

void
cuddLocalCacheInsert(
  DdLocalCache * cache,
  DdNodePtr * key,
  DdNode * value)
{
    unsigned int posn;
    DdLocalCacheItem *entry;

    posn = ddLCHash(key,cache->keysize,cache->shift);
    entry = (DdLocalCacheItem *) ((char *) cache->item +
                                  posn * cache->itemsize);
    memcpy(entry->key,key,cache->keysize * sizeof(DdNode *));
    entry->value = value;
#ifdef DD_CACHE_PROFILE
    entry->count++;
#endif

}